

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O1

float __thiscall Assimp::StreamReader<true,_true>::Get<float>(StreamReader<true,_true> *this)

{
  float *pfVar1;
  float fVar2;
  runtime_error *this_00;
  float fVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pfVar1 = (float *)((long)this->current + 4);
  if (pfVar1 <= this->limit) {
    fVar2 = *(float *)this->current;
    fVar3 = (float)((uint)fVar2 >> 0x18 | ((uint)fVar2 & 0xff0000) >> 8 |
                    ((uint)fVar2 & 0xff00) << 8 | (int)fVar2 << 0x18);
    if (this->le != false) {
      fVar3 = fVar2;
    }
    this->current = (int8_t *)pfVar1;
    return fVar3;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"End of file or stream limit was reached","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_007fa260;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }